

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O1

void helics::detail::convertFromBinary(byte *data,double *val)

{
  double *pdVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  double *currentVal;
  long lVar6;
  ulong uVar7;
  
  uVar3 = *(undefined4 *)(data + 4);
  uVar7 = (ulong)((uint)uVar3 >> 0x18 | (uint)(uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                 uVar3 << 0x18);
  if ((val != (double *)0x0) && (uVar7 != 0)) {
    memcpy(val,data + 8,uVar7 * 8);
  }
  if (((*data & 1) != 0) && (uVar7 != 0)) {
    pdVar1 = val + uVar7;
    puVar4 = (undefined1 *)((long)val + 7);
    do {
      lVar6 = 0;
      puVar5 = puVar4;
      do {
        uVar2 = *(undefined1 *)((long)val + lVar6);
        *(undefined1 *)((long)val + lVar6) = *puVar5;
        *puVar5 = uVar2;
        lVar6 = lVar6 + 1;
        puVar5 = puVar5 + -1;
      } while (lVar6 != 4);
      val = val + 1;
      puVar4 = puVar4 + 8;
    } while (val != pdVar1);
  }
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, double* val)
{
    const std::size_t size = getDataSize(data);
    if (val != nullptr && size > 0) {
        std::memcpy(val, data + 8, size * sizeof(double));
    }
    if ((data[0] & endianMask) != littleEndianCode) {
        double* currentVal = val;
        double* end = currentVal + size;
        while (currentVal != end) {
            checks::swapBytes<8>(reinterpret_cast<std::byte*>(currentVal++));
        }
    }
}